

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int spng_set_hist(spng_ctx *ctx,spng_hist *hist)

{
  undefined1 *puVar1;
  spng_chunk_bitfield sVar2;
  int iVar3;
  
  iVar3 = 1;
  if ((hist != (spng_hist *)0x0 && ctx != (spng_ctx *)0x0) &&
     (((ctx->data != (uchar *)0x0 || (iVar3 = 0x52, (ctx->field_0xcc & 0x10) != 0)) &&
      (iVar3 = read_chunks(ctx,0), iVar3 == 0)))) {
    sVar2 = ctx->stored;
    iVar3 = 0x36;
    if (((uint)sVar2 & 2) != 0) {
      memcpy(&ctx->hist,hist,0x200);
      ctx->stored = (spng_chunk_bitfield)((uint)sVar2 | 0x200);
      puVar1 = &(ctx->user).field_0x1;
      *puVar1 = *puVar1 | 2;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int spng_set_hist(spng_ctx *ctx, struct spng_hist *hist)
{
    SPNG_SET_CHUNK_BOILERPLATE(hist);

    if(!ctx->stored.plte) return SPNG_EHIST_NO_PLTE;

    ctx->hist = *hist;

    ctx->stored.hist = 1;
    ctx->user.hist = 1;

    return 0;
}